

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

char * baseFilename(char *filename)

{
  size_t sVar1;
  char *pcVar2;
  
  if (filename == (char *)0x0) {
    return (char *)0x0;
  }
  sVar1 = strlen(filename);
  pcVar2 = filename + sVar1;
  if (0 < (long)sVar1) {
    do {
      if (*pcVar2 == '/') break;
      pcVar2 = pcVar2 + -1;
    } while (filename < pcVar2);
  }
  return pcVar2 + (*pcVar2 == '/');
}

Assistant:

static const char *baseFilename(const char *filename) {
    const char *cur;
    if (filename == NULL)
        return(NULL);
    cur = &filename[strlen(filename)];
    while ((cur > filename) && (*cur != '/'))
        cur--;
    if (*cur == '/')
        return(cur + 1);
    return(cur);
}